

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O3

UDataMemory *
doOpenChoice(char *path,char *type,char *name,UDataMemoryIsAcceptable *isAcceptable,void *context,
            UErrorCode *pErrorCode)

{
  bool bVar1;
  byte bVar2;
  UBool UVar3;
  uint uVar4;
  int iVar5;
  ulong in_RAX;
  char *pcVar6;
  char *pcVar7;
  CharString *pCVar8;
  UDataMemory *pUVar9;
  char *dataPath;
  UErrorCode UVar10;
  StringPiece *this;
  long lVar11;
  UErrorCode *context_00;
  UErrorCode *in_stack_fffffffffffffdd8;
  undefined4 local_220;
  UErrorCode subErrorCode;
  char *local_218;
  UDataMemoryIsAcceptable *local_210;
  char *local_208;
  CharString pkgName;
  StringPiece local_1c0;
  StringPiece local_1b0;
  StringPiece local_1a0;
  StringPiece local_190;
  StringPiece local_180;
  StringPiece local_170;
  StringPiece local_160;
  StringPiece local_150;
  CharString treeName;
  CharString tocEntryName;
  CharString tocEntryPath;
  StringPiece local_80;
  StringPiece local_70;
  StringPiece local_60;
  StringPiece local_50;
  StringPiece local_40;
  
  subErrorCode = U_ZERO_ERROR;
  local_218 = name;
  local_210 = isAcceptable;
  local_208 = (char *)context;
  if (path == (char *)0x0) {
LAB_0017809e:
    local_220 = (undefined4)CONCAT71((int7)(in_RAX >> 8),1);
    bVar1 = false;
  }
  else {
    uVar4 = strcmp(path,"ICUDATA");
    in_RAX = (ulong)uVar4;
    if (uVar4 == 0) goto LAB_0017809e;
    uVar4 = strncmp(path,"icudt63l-",9);
    in_RAX = (ulong)uVar4;
    if (uVar4 == 0) goto LAB_0017809e;
    uVar4 = strncmp(path,"ICUDATA-",8);
    in_RAX = (ulong)uVar4;
    if (uVar4 == 0) goto LAB_0017809e;
    bVar1 = true;
    local_220 = 0;
  }
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&tocEntryName.buffer);
  tocEntryName.len = 0;
  *tocEntryName.buffer.ptr = '\0';
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&tocEntryPath.buffer);
  tocEntryPath.len = 0;
  *tocEntryPath.buffer.ptr = '\0';
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&pkgName.buffer);
  pkgName.len = 0;
  *pkgName.buffer.ptr = '\0';
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&treeName.buffer);
  treeName.len = 0;
  *treeName.buffer.ptr = '\0';
  if (path == (char *)0x0) {
    icu_63::StringPiece::StringPiece(&local_150,"icudt63l");
    icu_63::CharString::append(&pkgName,local_150.ptr_,local_150.length_,pErrorCode);
    path = (char *)0x0;
  }
  else {
    pcVar6 = strrchr(path,0x2f);
    pcVar7 = strchr(path,0x2f);
    UVar3 = uprv_pathIsAbsolute_63(path);
    if (pcVar6 == pcVar7 && UVar3 == '\0') {
      pcVar7 = strchr(path,0x2d);
      if (pcVar7 == (char *)0x0) {
        if (bVar1) {
          this = &local_80;
          icu_63::StringPiece::StringPiece(this,path);
        }
        else {
          this = &local_70;
          icu_63::StringPiece::StringPiece(this,"icudt63l");
        }
      }
      else {
        icu_63::StringPiece::StringPiece(&local_160,pcVar7 + 1);
        icu_63::CharString::append(&treeName,local_160.ptr_,local_160.length_,pErrorCode);
        if (bVar1) {
          icu_63::CharString::append(&pkgName,path,(int)pcVar7 - (int)path,pErrorCode);
          if (pcVar6 == (char *)0x0) {
            path = pkgName.buffer.ptr;
          }
          goto LAB_001782ab;
        }
        this = &local_60;
        icu_63::StringPiece::StringPiece(this,"icudt63l");
      }
    }
    else if (pcVar6 == (char *)0x0) {
      this = &local_50;
      icu_63::StringPiece::StringPiece(this,path);
    }
    else {
      this = &local_40;
      icu_63::StringPiece::StringPiece(this,pcVar6 + 1);
    }
    icu_63::CharString::append(&pkgName,this->ptr_,this->length_,pErrorCode);
  }
LAB_001782ab:
  icu_63::CharString::append(&tocEntryName,pkgName.buffer.ptr,pkgName.len,pErrorCode);
  icu_63::CharString::append(&tocEntryPath,pkgName.buffer.ptr,pkgName.len,pErrorCode);
  lVar11 = (long)tocEntryName.len;
  if (treeName.len != 0) {
    pCVar8 = icu_63::CharString::append(&tocEntryName,'/',pErrorCode);
    icu_63::CharString::append(pCVar8,treeName.buffer.ptr,treeName.len,pErrorCode);
    pCVar8 = icu_63::CharString::append(&tocEntryPath,'/',pErrorCode);
    icu_63::CharString::append(pCVar8,treeName.buffer.ptr,treeName.len,pErrorCode);
  }
  pCVar8 = icu_63::CharString::append(&tocEntryName,'/',pErrorCode);
  icu_63::StringPiece::StringPiece(&local_170,local_218);
  icu_63::CharString::append(pCVar8,local_170.ptr_,local_170.length_,pErrorCode);
  pCVar8 = icu_63::CharString::append(&tocEntryPath,'/',pErrorCode);
  icu_63::StringPiece::StringPiece(&local_180,local_218);
  icu_63::CharString::append(pCVar8,local_180.ptr_,local_180.length_,pErrorCode);
  if ((type != (char *)0x0) && (*type != '\0')) {
    icu_63::StringPiece::StringPiece(&local_190,".");
    pCVar8 = icu_63::CharString::append(&tocEntryName,local_190.ptr_,local_190.length_,pErrorCode);
    icu_63::StringPiece::StringPiece(&local_1a0,type);
    icu_63::CharString::append(pCVar8,local_1a0.ptr_,local_1a0.length_,pErrorCode);
    icu_63::StringPiece::StringPiece(&local_1b0,".");
    pCVar8 = icu_63::CharString::append(&tocEntryPath,local_1b0.ptr_,local_1b0.length_,pErrorCode);
    icu_63::StringPiece::StringPiece(&local_1c0,type);
    icu_63::CharString::append(pCVar8,local_1c0.ptr_,local_1c0.length_,pErrorCode);
  }
  pcVar6 = "icudt63l";
  if (path != (char *)0x0) {
    pcVar6 = path;
  }
  context_00 = (UErrorCode *)0x1784b5;
  pcVar7 = u_getDataDirectory_63();
  if ((byte)local_220 == 0) {
LAB_001784dc:
    if (gDataFileAccess == UDATA_PACKAGES_FIRST) {
      pUVar9 = doLoadFromCommonData
                         ((byte)local_220,tocEntryName.buffer.ptr,pcVar6,type,local_218,
                          (char *)local_210,local_208,(char *)&subErrorCode,
                          (UDataMemoryIsAcceptable *)pErrorCode,context_00,in_stack_fffffffffffffdd8
                          ,(UErrorCode *)CONCAT44(subErrorCode,local_220));
      if (pUVar9 != (UDataMemory *)0x0) goto LAB_0017870f;
      if (U_ZERO_ERROR < *pErrorCode) goto LAB_0017870c;
    }
    if ((gDataFileAccess & ~UDATA_PACKAGES_FIRST) == UDATA_DEFAULT_ACCESS) {
      bVar2 = (byte)local_220;
      if (pcVar7 != (char *)0x0) {
        bVar2 = (byte)local_220 & *pcVar7 == '\0';
      }
      if (bVar2 == 0) {
        context_00 = pErrorCode;
        pUVar9 = doLoadFromIndividualFiles
                           (pkgName.buffer.ptr,pcVar7,tocEntryPath.buffer.ptr + lVar11 + 1,pcVar6,
                            type,local_218,local_210,local_208,&subErrorCode,pErrorCode);
        if (pUVar9 != (UDataMemory *)0x0) goto LAB_0017870f;
        if (U_ZERO_ERROR < *pErrorCode) goto LAB_0017870c;
      }
    }
    if (gDataFileAccess < UDATA_PACKAGES_FIRST) {
      pUVar9 = doLoadFromCommonData
                         ((byte)local_220,tocEntryName.buffer.ptr,pcVar6,type,local_218,
                          (char *)local_210,local_208,(char *)&subErrorCode,
                          (UDataMemoryIsAcceptable *)pErrorCode,context_00,in_stack_fffffffffffffdd8
                          ,(UErrorCode *)CONCAT44(subErrorCode,local_220));
      if (pUVar9 != (UDataMemory *)0x0) goto LAB_0017870f;
      if (U_ZERO_ERROR < *pErrorCode) goto LAB_0017870c;
    }
    if ((gDataFileAccess == UDATA_NO_FILES) &&
       (pUVar9 = doLoadFromCommonData
                           ((byte)local_220,tocEntryName.buffer.ptr,pcVar6,type,local_218,
                            (char *)local_210,local_208,(char *)&subErrorCode,
                            (UDataMemoryIsAcceptable *)pErrorCode,context_00,
                            in_stack_fffffffffffffdd8,(UErrorCode *)CONCAT44(subErrorCode,local_220)
                           ), pUVar9 != (UDataMemory *)0x0)) goto LAB_0017870f;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      UVar10 = U_FILE_ACCESS_ERROR;
      if (U_ZERO_ERROR < subErrorCode) {
        UVar10 = subErrorCode;
      }
      *pErrorCode = UVar10;
    }
  }
  else {
    context_00 = (UErrorCode *)0x1784d4;
    iVar5 = strcmp(type,"res");
    if (iVar5 != 0) goto LAB_001784dc;
    iVar5 = strcmp(local_218,"zoneinfo64");
    if (((iVar5 != 0) && (iVar5 = strcmp(local_218,"timezoneTypes"), iVar5 != 0)) &&
       (iVar5 = strcmp(local_218,"windowsZones"), iVar5 != 0)) {
      context_00 = (UErrorCode *)0x17866a;
      iVar5 = strcmp(local_218,"metaZones");
      if (iVar5 != 0) goto LAB_001784dc;
    }
    context_00 = (UErrorCode *)0x17867a;
    dataPath = u_getTimeZoneFilesDirectory_63(pErrorCode);
    if (*dataPath == '\0') goto LAB_001784dc;
    context_00 = pErrorCode;
    pUVar9 = doLoadFromIndividualFiles
                       ("",dataPath,tocEntryPath.buffer.ptr + lVar11 + 1,"",type,local_218,local_210
                        ,local_208,&subErrorCode,pErrorCode);
    if (pUVar9 != (UDataMemory *)0x0) goto LAB_0017870f;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_001784dc;
  }
LAB_0017870c:
  pUVar9 = (UDataMemory *)0x0;
LAB_0017870f:
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&treeName.buffer);
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&pkgName.buffer);
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&tocEntryPath.buffer);
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&tocEntryName.buffer);
  return pUVar9;
}

Assistant:

static UDataMemory *
doOpenChoice(const char *path, const char *type, const char *name,
             UDataMemoryIsAcceptable *isAcceptable, void *context,
             UErrorCode *pErrorCode)
{
    UDataMemory         *retVal = NULL;

    const char         *dataPath;

    int32_t             tocEntrySuffixIndex;
    const char         *tocEntryPathSuffix;
    UErrorCode          subErrorCode=U_ZERO_ERROR;
    const char         *treeChar;

    UBool               isICUData = FALSE;


    /* Is this path ICU data? */
    if(path == NULL ||
       !strcmp(path, U_ICUDATA_ALIAS) ||  /* "ICUDATA" */
       !uprv_strncmp(path, U_ICUDATA_NAME U_TREE_SEPARATOR_STRING, /* "icudt26e-" */
                     uprv_strlen(U_ICUDATA_NAME U_TREE_SEPARATOR_STRING)) ||  
       !uprv_strncmp(path, U_ICUDATA_ALIAS U_TREE_SEPARATOR_STRING, /* "ICUDATA-" */
                     uprv_strlen(U_ICUDATA_ALIAS U_TREE_SEPARATOR_STRING))) {
      isICUData = TRUE;
    }

#if (U_FILE_SEP_CHAR != U_FILE_ALT_SEP_CHAR)  /* Windows:  try "foo\bar" and "foo/bar" */
    /* remap from alternate path char to the main one */
    CharString altSepPath;
    if(path) {
        if(uprv_strchr(path,U_FILE_ALT_SEP_CHAR) != NULL) {
            altSepPath.append(path, *pErrorCode);
            char *p;
            while ((p = uprv_strchr(altSepPath.data(), U_FILE_ALT_SEP_CHAR)) != NULL) {
                *p = U_FILE_SEP_CHAR;
            }
#if defined (UDATA_DEBUG)
            fprintf(stderr, "Changed path from [%s] to [%s]\n", path, altSepPath.s);
#endif
            path = altSepPath.data();
        }
    }
#endif

    CharString tocEntryName; /* entry name in tree format. ex:  'icudt28b/coll/ar.res' */
    CharString tocEntryPath; /* entry name in path format. ex:  'icudt28b\\coll\\ar.res' */

    CharString pkgName;
    CharString treeName;

    /* ======= Set up strings */
    if(path==NULL) {
        pkgName.append(U_ICUDATA_NAME, *pErrorCode);
    } else {
        const char *pkg;
        const char *first;
        pkg = uprv_strrchr(path, U_FILE_SEP_CHAR);
        first = uprv_strchr(path, U_FILE_SEP_CHAR);
        if(uprv_pathIsAbsolute(path) || (pkg != first)) { /* more than one slash in the path- not a tree name */
            /* see if this is an /absolute/path/to/package  path */
            if(pkg) {
                pkgName.append(pkg+1, *pErrorCode);
            } else {
                pkgName.append(path, *pErrorCode);
            }
        } else {
            treeChar = uprv_strchr(path, U_TREE_SEPARATOR);
            if(treeChar) { 
                treeName.append(treeChar+1, *pErrorCode); /* following '-' */
                if(isICUData) {
                    pkgName.append(U_ICUDATA_NAME, *pErrorCode);
                } else {
                    pkgName.append(path, (int32_t)(treeChar-path), *pErrorCode);
                    if (first == NULL) {
                        /*
                        This user data has no path, but there is a tree name.
                        Look up the correct path from the data cache later.
                        */
                        path = pkgName.data();
                    }
                }
            } else {
                if(isICUData) {
                    pkgName.append(U_ICUDATA_NAME, *pErrorCode);
                } else {
                    pkgName.append(path, *pErrorCode);
                }
            }
        }
    }

#ifdef UDATA_DEBUG
    fprintf(stderr, " P=%s T=%s\n", pkgName.data(), treeName.data());
#endif

    /* setting up the entry name and file name 
     * Make up a full name by appending the type to the supplied
     *  name, assuming that a type was supplied.
     */

    /* prepend the package */
    tocEntryName.append(pkgName, *pErrorCode);
    tocEntryPath.append(pkgName, *pErrorCode);
    tocEntrySuffixIndex = tocEntryName.length();

    if(!treeName.isEmpty()) {
        tocEntryName.append(U_TREE_ENTRY_SEP_CHAR, *pErrorCode).append(treeName, *pErrorCode);
        tocEntryPath.append(U_FILE_SEP_CHAR, *pErrorCode).append(treeName, *pErrorCode);
    }

    tocEntryName.append(U_TREE_ENTRY_SEP_CHAR, *pErrorCode).append(name, *pErrorCode);
    tocEntryPath.append(U_FILE_SEP_CHAR, *pErrorCode).append(name, *pErrorCode);
    if(type!=NULL && *type!=0) {
        tocEntryName.append(".", *pErrorCode).append(type, *pErrorCode);
        tocEntryPath.append(".", *pErrorCode).append(type, *pErrorCode);
    }
    // The +1 is for the U_FILE_SEP_CHAR that is always appended above.
    tocEntryPathSuffix = tocEntryPath.data() + tocEntrySuffixIndex + 1; /* suffix starts here */

#ifdef UDATA_DEBUG
    fprintf(stderr, " tocEntryName = %s\n", tocEntryName.data());
    fprintf(stderr, " tocEntryPath = %s\n", tocEntryName.data());
#endif

#if U_PLATFORM_HAS_WINUWP_API == 0 // Windows UWP Platform does not support dll icu data at this time
    if(path == NULL) {
        path = COMMON_DATA_NAME; /* "icudt26e" */
    }
#else
    // Windows UWP expects only a single data file.
    path = COMMON_DATA_NAME; /* "icudt26e" */
#endif

    /************************ Begin loop looking for ind. files ***************/
#ifdef UDATA_DEBUG
    fprintf(stderr, "IND: inBasename = %s, pkg=%s\n", "(n/a)", packageNameFromPath(path));
#endif

    /* End of dealing with a null basename */
    dataPath = u_getDataDirectory();

    /****    Time zone individual files override  */
    if (isICUData && isTimeZoneFile(name, type)) {
        const char *tzFilesDir = u_getTimeZoneFilesDirectory(pErrorCode);
        if (tzFilesDir[0] != 0) {
#ifdef UDATA_DEBUG
            fprintf(stderr, "Trying Time Zone Files directory = %s\n", tzFilesDir);
#endif
            retVal = doLoadFromIndividualFiles(/* pkgName.data() */ "", tzFilesDir, tocEntryPathSuffix,
                            /* path */ "", type, name, isAcceptable, context, &subErrorCode, pErrorCode);
            if((retVal != NULL) || U_FAILURE(*pErrorCode)) {
                return retVal;
            }
        }
    }

    /****    COMMON PACKAGE  - only if packages are first. */
    if(gDataFileAccess == UDATA_PACKAGES_FIRST) {
#ifdef UDATA_DEBUG
        fprintf(stderr, "Trying packages (UDATA_PACKAGES_FIRST)\n");
#endif
        /* #2 */
        retVal = doLoadFromCommonData(isICUData, 
                            pkgName.data(), dataPath, tocEntryPathSuffix, tocEntryName.data(),
                            path, type, name, isAcceptable, context, &subErrorCode, pErrorCode);
        if((retVal != NULL) || U_FAILURE(*pErrorCode)) {
            return retVal;
        }
    }

    /****    INDIVIDUAL FILES  */
    if((gDataFileAccess==UDATA_PACKAGES_FIRST) ||
       (gDataFileAccess==UDATA_FILES_FIRST)) {
#ifdef UDATA_DEBUG
        fprintf(stderr, "Trying individual files\n");
#endif
        /* Check to make sure that there is a dataPath to iterate over */
        if ((dataPath && *dataPath) || !isICUData) {
            retVal = doLoadFromIndividualFiles(pkgName.data(), dataPath, tocEntryPathSuffix,
                            path, type, name, isAcceptable, context, &subErrorCode, pErrorCode);
            if((retVal != NULL) || U_FAILURE(*pErrorCode)) {
                return retVal;
            }
        }
    }

    /****    COMMON PACKAGE  */
    if((gDataFileAccess==UDATA_ONLY_PACKAGES) || 
       (gDataFileAccess==UDATA_FILES_FIRST)) {
#ifdef UDATA_DEBUG
        fprintf(stderr, "Trying packages (UDATA_ONLY_PACKAGES || UDATA_FILES_FIRST)\n");
#endif
        retVal = doLoadFromCommonData(isICUData,
                            pkgName.data(), dataPath, tocEntryPathSuffix, tocEntryName.data(),
                            path, type, name, isAcceptable, context, &subErrorCode, pErrorCode);
        if((retVal != NULL) || U_FAILURE(*pErrorCode)) {
            return retVal;
        }
    }
    
    /* Load from DLL.  If we haven't attempted package load, we also haven't had any chance to
        try a DLL (static or setCommonData/etc)  load.
         If we ever have a "UDATA_ONLY_FILES", add it to the or list here.  */  
    if(gDataFileAccess==UDATA_NO_FILES) {
#ifdef UDATA_DEBUG
        fprintf(stderr, "Trying common data (UDATA_NO_FILES)\n");
#endif
        retVal = doLoadFromCommonData(isICUData,
                            pkgName.data(), "", tocEntryPathSuffix, tocEntryName.data(),
                            path, type, name, isAcceptable, context, &subErrorCode, pErrorCode);
        if((retVal != NULL) || U_FAILURE(*pErrorCode)) {
            return retVal;
        }
    }

    /* data not found */
    if(U_SUCCESS(*pErrorCode)) {
        if(U_SUCCESS(subErrorCode)) {
            /* file not found */
            *pErrorCode=U_FILE_ACCESS_ERROR;
        } else {
            /* entry point not found or rejected */
            *pErrorCode=subErrorCode;
        }
    }
    return retVal;
}